

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gus_pat.cpp
# Opt level: O0

int convert_16sp(uchar *data,_sample *gus_sample)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  short *psVar5;
  int *piVar6;
  byte *pbVar7;
  ushort *puVar8;
  byte *pbVar9;
  ushort *local_60;
  short *write_data_b;
  short *write_data_a;
  short *write_data;
  uchar *read_end;
  uchar *read_data;
  unsigned_long new_length;
  unsigned_long dloop_length;
  unsigned_long loop_length;
  _sample *gus_sample_local;
  uchar *data_local;
  
  uVar2 = gus_sample->loop_end - gus_sample->loop_start;
  uVar3 = (ulong)uVar2;
  uVar4 = (ulong)gus_sample->data_length + uVar3 * 2;
  uVar1 = gus_sample->loop_start;
  psVar5 = (short *)calloc((uVar4 >> 1) + 2,2);
  gus_sample->data = psVar5;
  if (gus_sample->data == (short *)0x0) {
    piVar6 = __errno_location();
    _WM_ERROR("convert_16sp",0x1b8,1,"to parse sample",*piVar6);
    data_local._4_4_ = -1;
  }
  else {
    puVar8 = (ushort *)gus_sample->data;
    pbVar7 = data;
    do {
      read_end = pbVar7;
      write_data_a = (short *)puVar8;
      *write_data_a = (ushort)*read_end;
      pbVar7 = read_end + 2;
      puVar8 = (ushort *)(write_data_a + 1);
      *write_data_a = *write_data_a | (ushort)read_end[1] << 8;
    } while (pbVar7 < data + uVar1);
    *puVar8 = (ushort)*pbVar7;
    *puVar8 = *puVar8 | (ushort)read_end[3] << 8;
    write_data_b = (short *)(puVar8 + uVar3);
    *write_data_b = *puVar8;
    write_data_a = write_data_a + 2;
    uVar1 = gus_sample->loop_end;
    puVar8 = (ushort *)(write_data_a + uVar3);
    pbVar7 = read_end + 4;
    do {
      read_end = pbVar7;
      local_60 = puVar8;
      write_data_b = (short *)((ushort *)write_data_b + -1);
      *write_data_a = (ushort)*read_end;
      pbVar7 = read_end + 2;
      *write_data_a = *write_data_a | (ushort)read_end[1] << 8;
      *write_data_b = *write_data_a;
      puVar8 = local_60 + 1;
      *local_60 = *write_data_a;
      write_data_a = write_data_a + 1;
    } while (pbVar7 < data + uVar1);
    pbVar9 = read_end + 3;
    *write_data_a = (ushort)*pbVar7;
    read_end = read_end + 4;
    *write_data_a = *write_data_a | (ushort)*pbVar9 << 8;
    local_60 = local_60 + 2;
    *puVar8 = *write_data_a;
    uVar1 = gus_sample->data_length;
    if (read_end != data + uVar1) {
      do {
        pbVar7 = read_end + 1;
        *local_60 = (ushort)*read_end;
        read_end = read_end + 2;
        *local_60 = *local_60 | (ushort)*pbVar7 << 8;
        local_60 = local_60 + 1;
      } while (read_end < data + uVar1);
    }
    gus_sample->loop_start = gus_sample->loop_start + uVar2;
    gus_sample->loop_end = gus_sample->loop_end + (int)(uVar3 * 2);
    gus_sample->data_length = (uint)uVar4;
    gus_sample->modes = gus_sample->modes ^ 8;
    gus_sample->loop_start = gus_sample->loop_start >> 1;
    gus_sample->loop_end = gus_sample->loop_end >> 1;
    gus_sample->data_length = gus_sample->data_length >> 1;
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

static int convert_16sp(unsigned char *data, struct _sample *gus_sample) {
	unsigned long int loop_length = gus_sample->loop_end
			- gus_sample->loop_start;
	unsigned long int dloop_length = loop_length * 2;
	unsigned long int new_length = gus_sample->data_length + dloop_length;
	unsigned char *read_data = data;
	unsigned char *read_end = data + gus_sample->loop_start;
	signed short int *write_data = NULL;
	signed short int *write_data_a = NULL;
	signed short int *write_data_b = NULL;

	SAMPLE_CONVERT_DEBUG(__FUNCTION__);
	gus_sample->data = (short*)calloc(((new_length >> 1) + 2),
			sizeof(signed short int));
	if (gus_sample->data != NULL) {
		write_data = gus_sample->data;
		do {
			*write_data = (*read_data++);
			*write_data++ |= (*read_data++) << 8;
		} while (read_data < read_end);

		*write_data = (*read_data++);
		*write_data |= (*read_data++) << 8;
		write_data_a = write_data + (dloop_length >> 1);
		*write_data_a-- = *write_data;
		write_data++;
		write_data_b = write_data + (dloop_length >> 1);
		read_end = data + gus_sample->loop_end;
		do {
			*write_data = (*read_data++);
			*write_data |= (*read_data++) << 8;
			*write_data_a-- = *write_data;
			*write_data_b++ = *write_data;
			write_data++;
		} while (read_data < read_end);

		*write_data = *(read_data++);
		*write_data |= (*read_data++) << 8;
		*write_data_b++ = *write_data;
		read_end = data + gus_sample->data_length;
		if (read_data != read_end) {
			do {
				*write_data_b = *(read_data++);
				*write_data_b++ |= (*read_data++) << 8;
			} while (read_data < read_end);
		}
		gus_sample->loop_start += loop_length;
		gus_sample->loop_end += dloop_length;
		gus_sample->data_length = new_length;
		gus_sample->modes ^= SAMPLE_PINGPONG;
		gus_sample->loop_start >>= 1;
		gus_sample->loop_end >>= 1;
		gus_sample->data_length >>= 1;
		return 0;
	}

	_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_MEM, "to parse sample", errno);
	return -1;
}